

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

ImGuiTabItem * ImGui::TabBarFindMostRecentlySelectedTabForActiveWindow(ImGuiTabBar *tab_bar)

{
  ImGuiTabItem *pIVar1;
  long lVar2;
  ImGuiTabItem *tab;
  ImGuiTabItem *pIVar3;
  
  lVar2 = (long)(tab_bar->Tabs).Size;
  if (0 < lVar2) {
    pIVar3 = (tab_bar->Tabs).Data;
    pIVar1 = (ImGuiTabItem *)0x0;
    do {
      if ((((pIVar1 == (ImGuiTabItem *)0x0) ||
           (pIVar1->LastFrameSelected < pIVar3->LastFrameSelected)) &&
          (pIVar3->Window != (ImGuiWindow *)0x0)) && (pIVar3->Window->WasActive != false)) {
        pIVar1 = pIVar3;
      }
      pIVar3 = pIVar3 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    return pIVar1;
  }
  return (ImGuiTabItem *)0x0;
}

Assistant:

ImGuiTabItem* ImGui::TabBarFindMostRecentlySelectedTabForActiveWindow(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* most_recently_selected_tab = NULL;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        if (most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected)
            if (tab->Window && tab->Window->WasActive)
                most_recently_selected_tab = tab;
    }
    return most_recently_selected_tab;
}